

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

bool __thiscall
phpconvert::ZendParser::isRestricted(ZendParser *this,string *className,string *classNameLower)

{
  bool bVar1;
  undefined1 local_21;
  string *classNameLower_local;
  string *className_local;
  ZendParser *this_local;
  
  bVar1 = isKeyword(this,classNameLower);
  local_21 = true;
  if (!bVar1) {
    local_21 = isBuiltInType(this,className);
  }
  return local_21;
}

Assistant:

bool ZendParser::isRestricted(const string &className, const string &classNameLower) { //@todo has no sense
        return isKeyword(classNameLower) //cant be keyword here , keywords must not be touched
               || isBuiltInType(className); //@todo isDuplicate too
    }